

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.cpp
# Opt level: O3

void duckdb_zstd::ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  short sVar1;
  ZSTD_paramSwitch_e ZVar2;
  undefined8 in_RAX;
  ZSTD_entropyCTables_t *pZVar3;
  long lVar4;
  uint *puVar5;
  uint *puVar6;
  long lVar7;
  byte bVar8;
  int iVar9;
  U32 UVar10;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar11 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  uint lit;
  undefined8 uStack_28;
  
  bVar8 = 0;
  ZVar2 = optPtr->literalCompressionMode;
  optPtr->priceType = zop_dynamic;
  uStack_28 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 9) {
      optPtr->priceType = zop_predef;
    }
    pZVar3 = optPtr->symbolCosts;
    if ((pZVar3->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      if (ZVar2 != ZSTD_ps_disable) {
        optPtr->litSum = 0;
        lVar4 = 0;
        do {
          UVar10 = HUF_getNbBitsFromCTable((HUF_CElt *)optPtr->symbolCosts,(U32)lVar4);
          uVar19 = 1 << (0xbU - (char)UVar10 & 0x1f);
          if (UVar10 == 0) {
            uVar19 = 1;
          }
          optPtr->litFreq[lVar4] = uVar19;
          optPtr->litSum = optPtr->litSum + uVar19;
          lVar4 = lVar4 + 1;
        } while (lVar4 != 0x100);
        pZVar3 = optPtr->symbolCosts;
      }
      sVar1 = (short)(pZVar3->fse).litlengthCTable[0];
      lVar4 = 1;
      if (sVar1 != 0) {
        lVar4 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->litLengthSum = 0;
      puVar5 = optPtr->litLengthFreq;
      lVar7 = 0;
      do {
        uVar19 = (pZVar3->fse).litlengthCTable[lVar4 + lVar7 * 2 + 2] + 0xffff;
        uVar20 = 1 << (10U - (char)(uVar19 >> 0x10) & 0x1f);
        if (uVar19 < 0x10000) {
          uVar20 = 1;
        }
        puVar5[lVar7] = uVar20;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar20;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x24);
      sVar1 = (short)(pZVar3->fse).matchlengthCTable[0];
      lVar4 = 1;
      if (sVar1 != 0) {
        lVar4 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->matchLengthSum = 0;
      puVar5 = optPtr->matchLengthFreq;
      lVar7 = 0;
      do {
        uVar19 = (pZVar3->fse).matchlengthCTable[lVar4 + lVar7 * 2 + 2] + 0xffff;
        uVar20 = 1 << (10U - (char)(uVar19 >> 0x10) & 0x1f);
        if (uVar19 < 0x10000) {
          uVar20 = 1;
        }
        puVar5[lVar7] = uVar20;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar20;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x35);
      sVar1 = (short)(pZVar3->fse).offcodeCTable[0];
      lVar4 = 1;
      if (sVar1 != 0) {
        lVar4 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      }
      optPtr->offCodeSum = 0;
      puVar5 = optPtr->offCodeFreq;
      lVar7 = 0;
      do {
        uVar19 = (pZVar3->fse).offcodeCTable[lVar4 + lVar7 * 2 + 2] + 0xffff;
        uVar20 = 1 << (10U - (char)(uVar19 >> 0x10) & 0x1f);
        if (uVar19 < 0x10000) {
          uVar20 = 1;
        }
        puVar5[lVar7] = uVar20;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar20;
        lVar7 = lVar7 + 1;
      } while (lVar7 != 0x20);
      goto LAB_0127a8ee;
    }
    if (ZVar2 != ZSTD_ps_disable) {
      uStack_28 = CONCAT44(0xff,(int)in_RAX);
      HIST_count_simple(optPtr->litFreq,(uint *)((long)&uStack_28 + 4),src,srcSize);
      puVar5 = optPtr->litFreq;
      lVar4 = 0;
      iVar9 = 0;
      iVar12 = 0;
      iVar13 = 0;
      iVar14 = 0;
      do {
        puVar6 = puVar5 + lVar4;
        uVar19 = ((*puVar6 >> 8) - (uint)(*puVar6 == 0)) + 1;
        uVar20 = ((puVar6[1] >> 8) - (uint)(puVar6[1] == 0)) + 1;
        uVar21 = ((puVar6[2] >> 8) - (uint)(puVar6[2] == 0)) + 1;
        uVar22 = ((puVar6[3] >> 8) - (uint)(puVar6[3] == 0)) + 1;
        iVar9 = iVar9 + uVar19;
        iVar12 = iVar12 + uVar20;
        iVar13 = iVar13 + uVar21;
        iVar14 = iVar14 + uVar22;
        puVar6 = puVar5 + lVar4;
        *puVar6 = uVar19;
        puVar6[1] = uVar20;
        puVar6[2] = uVar21;
        puVar6[3] = uVar22;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x100);
      optPtr->litSum = iVar14 + iVar12 + iVar13 + iVar9;
    }
    switchD_00b03519::default(optPtr->litLengthFreq,&DAT_01485900,0x90);
    optPtr->litLengthSum = 0x28;
    auVar16 = _DAT_012b0ff0;
    puVar5 = optPtr->matchLengthFreq;
    lVar4 = 3;
    auVar11 = _DAT_013320d0;
    auVar18 = _DAT_012b0fe0;
    do {
      auVar23 = auVar18 ^ auVar16;
      if (auVar23._4_4_ == -0x80000000 && auVar23._0_4_ < -0x7fffffcb) {
        puVar5[lVar4 + -3] = 1;
        puVar5[lVar4 + -2] = 1;
      }
      auVar23 = auVar11 ^ auVar16;
      if (auVar23._4_4_ == -0x80000000 && auVar23._0_4_ < -0x7fffffcb) {
        puVar5[lVar4 + -1] = 1;
        puVar5[lVar4] = 1;
      }
      lVar7 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar7 + 4;
      lVar7 = auVar11._8_8_;
      auVar11._0_8_ = auVar11._0_8_ + 4;
      auVar11._8_8_ = lVar7 + 4;
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x3b);
    optPtr->matchLengthSum = 0x35;
    puVar5 = &DAT_01485990;
    puVar6 = optPtr->offCodeFreq;
    for (lVar4 = 0x20; lVar4 != 0; lVar4 = lVar4 + -1) {
      *puVar6 = *puVar5;
      puVar5 = puVar5 + (ulong)bVar8 * -2 + 1;
      puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    }
    UVar10 = 0x35;
  }
  else {
    if (ZVar2 != ZSTD_ps_disable) {
      puVar5 = optPtr->litFreq;
      iVar9 = 0;
      iVar12 = 0;
      iVar13 = 0;
      iVar14 = 0;
      lVar4 = 0;
      do {
        puVar6 = puVar5 + lVar4;
        iVar9 = iVar9 + *puVar6;
        iVar12 = iVar12 + puVar6[1];
        iVar13 = iVar13 + puVar6[2];
        iVar14 = iVar14 + puVar6[3];
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x100);
      UVar10 = iVar14 + iVar12 + iVar13 + iVar9;
      if (0x1fff < UVar10) {
        iVar9 = 0x1f;
        if (UVar10 >> 0xc != 0) {
          for (; (UVar10 >> 0xc) >> iVar9 == 0; iVar9 = iVar9 + -1) {
          }
        }
        iVar12 = 0;
        iVar13 = 0;
        iVar14 = 0;
        iVar15 = 0;
        lVar4 = 0;
        auVar16._4_12_ = SUB1612((undefined1  [16])0x0,4);
        auVar16._0_4_ = iVar9;
        do {
          puVar6 = puVar5 + lVar4;
          lVar7 = auVar16._0_8_;
          uVar19 = (*puVar6 >> lVar7) + 1;
          uVar20 = (puVar6[1] >> lVar7) + 1;
          uVar21 = (puVar6[2] >> lVar7) + 1;
          uVar22 = (puVar6[3] >> lVar7) + 1;
          iVar12 = iVar12 + uVar19;
          iVar13 = iVar13 + uVar20;
          iVar14 = iVar14 + uVar21;
          iVar15 = iVar15 + uVar22;
          puVar6 = puVar5 + lVar4;
          *puVar6 = uVar19;
          puVar6[1] = uVar20;
          puVar6[2] = uVar21;
          puVar6[3] = uVar22;
          lVar4 = lVar4 + 4;
        } while (lVar4 != 0x100);
        UVar10 = iVar15 + iVar13 + iVar14 + iVar12;
      }
      optPtr->litSum = UVar10;
    }
    puVar5 = optPtr->litLengthFreq;
    iVar9 = 0;
    iVar12 = 0;
    iVar13 = 0;
    iVar14 = 0;
    lVar4 = 0;
    do {
      puVar6 = puVar5 + lVar4;
      iVar9 = iVar9 + *puVar6;
      iVar12 = iVar12 + puVar6[1];
      iVar13 = iVar13 + puVar6[2];
      iVar14 = iVar14 + puVar6[3];
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x24);
    UVar10 = iVar14 + iVar12 + iVar13 + iVar9;
    if (0xfff < UVar10) {
      iVar9 = 0x1f;
      if (UVar10 >> 0xb != 0) {
        for (; (UVar10 >> 0xb) >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      iVar12 = 0;
      iVar13 = 0;
      iVar14 = 0;
      iVar15 = 0;
      lVar4 = 0;
      auVar23._4_12_ = SUB1612((undefined1  [16])0x0,4);
      auVar23._0_4_ = iVar9;
      do {
        puVar6 = puVar5 + lVar4;
        lVar7 = auVar23._0_8_;
        uVar19 = (*puVar6 >> lVar7) + 1;
        uVar20 = (puVar6[1] >> lVar7) + 1;
        uVar21 = (puVar6[2] >> lVar7) + 1;
        uVar22 = (puVar6[3] >> lVar7) + 1;
        iVar12 = iVar12 + uVar19;
        iVar13 = iVar13 + uVar20;
        iVar14 = iVar14 + uVar21;
        iVar15 = iVar15 + uVar22;
        puVar6 = puVar5 + lVar4;
        *puVar6 = uVar19;
        puVar6[1] = uVar20;
        puVar6[2] = uVar21;
        puVar6[3] = uVar22;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x24);
      UVar10 = iVar15 + iVar13 + iVar14 + iVar12;
    }
    optPtr->litLengthSum = UVar10;
    puVar5 = optPtr->matchLengthFreq;
    uVar19 = 0;
    lVar4 = 0;
    do {
      uVar19 = uVar19 + puVar5[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 0x35);
    if (0xfff < uVar19) {
      iVar9 = 0x1f;
      if (uVar19 >> 0xb != 0) {
        for (; (uVar19 >> 0xb) >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      lVar4 = 0;
      uVar19 = 0;
      do {
        uVar20 = puVar5[lVar4] >> ((byte)iVar9 & 0x1f);
        uVar19 = uVar19 + uVar20 + 1;
        puVar5[lVar4] = uVar20 + 1;
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0x35);
    }
    optPtr->matchLengthSum = uVar19;
    puVar5 = optPtr->offCodeFreq;
    iVar9 = 0;
    iVar12 = 0;
    iVar13 = 0;
    iVar14 = 0;
    lVar4 = 0;
    do {
      puVar6 = puVar5 + lVar4;
      iVar9 = iVar9 + *puVar6;
      iVar12 = iVar12 + puVar6[1];
      iVar13 = iVar13 + puVar6[2];
      iVar14 = iVar14 + puVar6[3];
      lVar4 = lVar4 + 4;
    } while (lVar4 != 0x20);
    UVar10 = iVar14 + iVar12 + iVar13 + iVar9;
    if (0xfff < UVar10) {
      iVar9 = 0x1f;
      if (UVar10 >> 0xb != 0) {
        for (; (UVar10 >> 0xb) >> iVar9 == 0; iVar9 = iVar9 + -1) {
        }
      }
      iVar12 = 0;
      iVar13 = 0;
      iVar14 = 0;
      iVar15 = 0;
      lVar4 = 0;
      auVar17._4_12_ = SUB1612((undefined1  [16])0x0,4);
      auVar17._0_4_ = iVar9;
      do {
        puVar6 = puVar5 + lVar4;
        lVar7 = auVar17._0_8_;
        uVar19 = (*puVar6 >> lVar7) + 1;
        uVar20 = (puVar6[1] >> lVar7) + 1;
        uVar21 = (puVar6[2] >> lVar7) + 1;
        uVar22 = (puVar6[3] >> lVar7) + 1;
        iVar12 = iVar12 + uVar19;
        iVar13 = iVar13 + uVar20;
        iVar14 = iVar14 + uVar21;
        iVar15 = iVar15 + uVar22;
        puVar6 = puVar5 + lVar4;
        *puVar6 = uVar19;
        puVar6[1] = uVar20;
        puVar6[2] = uVar21;
        puVar6[3] = uVar22;
        lVar4 = lVar4 + 4;
      } while (lVar4 != 0x20);
      UVar10 = iVar15 + iVar13 + iVar14 + iVar12;
    }
  }
  optPtr->offCodeSum = UVar10;
LAB_0127a8ee:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    int const compressedLiterals = ZSTD_compressedLiterals(optPtr);
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* no literals stats collected -> first block assumed -> init */

        /* heuristic: use pre-defined stats for too small inputs */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {
            DEBUGLOG(5, "srcSize <= %i : use predefined stats", ZSTD_PREDEF_THRESHOLD);
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {

            /* huffman stats covering the full value set : table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            if (compressedLiterals) {
                /* generate literals statistics from huffman table */
                unsigned lit;
                assert(optPtr->litFreq != NULL);
                optPtr->litSum = 0;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBitsFromCTable(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* first block, no dictionary */

            assert(optPtr->litFreq != NULL);
            if (compressedLiterals) {
                /* base initial cost of literals on direct frequency within src */
                unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
                optPtr->litSum = ZSTD_downscaleStats(optPtr->litFreq, MaxLit, 8, base_0possible);
            }

            {   unsigned const baseLLfreqs[MaxLL+1] = {
                    4, 2, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->litLengthFreq, baseLLfreqs, sizeof(baseLLfreqs));
                optPtr->litLengthSum = sum_u32(baseLLfreqs, MaxLL+1);
            }

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned const baseOFCfreqs[MaxOff+1] = {
                    6, 2, 1, 1, 2, 3, 4, 4,
                    4, 3, 2, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1,
                    1, 1, 1, 1, 1, 1, 1, 1
                };
                ZSTD_memcpy(optPtr->offCodeFreq, baseOFCfreqs, sizeof(baseOFCfreqs));
                optPtr->offCodeSum = sum_u32(baseOFCfreqs, MaxOff+1);
            }

        }

    } else {   /* new block : scale down accumulated statistics */

        if (compressedLiterals)
            optPtr->litSum = ZSTD_scaleStats(optPtr->litFreq, MaxLit, 12);
        optPtr->litLengthSum = ZSTD_scaleStats(optPtr->litLengthFreq, MaxLL, 11);
        optPtr->matchLengthSum = ZSTD_scaleStats(optPtr->matchLengthFreq, MaxML, 11);
        optPtr->offCodeSum = ZSTD_scaleStats(optPtr->offCodeFreq, MaxOff, 11);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}